

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

void __thiscall soul::StructuralParser::parseStaticAssert(StructuralParser *this)

{
  ModuleBase *pMVar1;
  Allocator *allocator;
  CommaSeparatedList *pCVar2;
  pool_ref<soul::AST::Expression> *in_R8;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args;
  Context context;
  SourceCodeText *local_38;
  char *local_30;
  Scope *local_28;
  pool_ref<soul::AST::StaticAssertion> local_20;
  
  local_38 = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_38 != (SourceCodeText *)0x0) {
    (local_38->super_RefCountedObject).refCount = (local_38->super_RefCountedObject).refCount + 1;
  }
  local_30 = (this->super_SOULTokeniser).location.location.data;
  local_28 = this->currentScope;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::skip(&this->super_SOULTokeniser);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
  pCVar2 = parseCommaSeparatedListOfExpressions(this,false,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    allocator = (Allocator *)(pCVar2->items).items;
    args.e = in_R8;
    args.s = (pool_ref<soul::AST::Expression> *)
             (&(allocator->pool).pools.
               super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (pCVar2->items).numActive);
    local_20.object =
         ASTUtilities::createStaticAssertion
                   ((ASTUtilities *)&local_38,(Context *)this->allocator,allocator,args);
    std::
    vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>
    ::emplace_back<soul::pool_ref<soul::AST::StaticAssertion>>
              ((vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>
                *)&pMVar1->staticAssertions,&local_20);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseStaticAssert()
    {
        auto context = getContext();
        skip();
        expect (Operator::openParen);
        auto& args = parseCommaSeparatedListOfExpressions (false, false);
        expect (Operator::semicolon);
        module->staticAssertions.push_back (ASTUtilities::createStaticAssertion (context, allocator, args.items));
    }